

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

bool cvui::mouse(int theButton,int theQuery)

{
  bool bVar1;
  allocator<char> local_39;
  String local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  bVar1 = mouse(&local_38,theButton,theQuery);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool mouse(int theButton, int theQuery) {
	return mouse("", theButton, theQuery);
}